

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnExport
          (BinaryReaderObjdump *this,Index index,ExternalKind kind,Index item_index,string_view name
          )

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  ulong uVar3;
  
  if ((int)kind < 5) {
    PrintDetails(this," - %s[%u]",*(undefined8 *)(g_kind_name + (long)(int)kind * 8),
                 (ulong)item_index);
    if (kind == First) {
      pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      pbVar2 = (pOVar1->function_names).names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (ulong)item_index;
      if (uVar3 < (ulong)((long)(pOVar1->function_names).names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
        if (pbVar2[uVar3]._M_string_length != 0) {
          PrintDetails(this," <%.*s>",pbVar2[uVar3]._M_string_length,pbVar2[uVar3]._M_dataplus._M_p)
          ;
        }
      }
    }
  }
  else {
    PrintDetails(this," - %s[%u]","<error_kind>",(ulong)item_index);
  }
  PrintDetails(this," -> \"%.*s\"\n",name.size_ & 0xffffffff,name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnExport(Index index,
                                     ExternalKind kind,
                                     Index item_index,
                                     string_view name) {
  PrintDetails(" - %s[%" PRIindex "]", GetKindName(kind), item_index);
  if (kind == ExternalKind::Func) {
    auto name = GetFunctionName(item_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
  }

  PrintDetails(" -> \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(name));
  return Result::Ok;
}